

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

void syms_init(void)

{
  syms_free();
  scope = (symtbl_t *)mmalloc(0x28);
  root = scope;
  scope->scope_id = 0;
  scope->num_syms = 0;
  scope->num_children = 0;
  scope->syms = (sym_t **)0x0;
  scope->children = (symtbl_t **)0x0;
  scope->parent = (symtbl_t *)0x0;
  scope_id = 0;
  return;
}

Assistant:

void syms_init()
{
    syms_free();
    root = (symtbl_t*)mmalloc(sizeof(symtbl_t));
    root->scope_id = 0;
    root->num_syms = 0;
    root->num_children = 0;
    root->parent = NULL;
    root->children = NULL;
    root->syms = NULL;

    scope_id = 0;
    cur_scope_id = 0;

    scope = root;
}